

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall Component_validName_Test::TestBody(Component_validName_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_170 [8];
  Message local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128 [8];
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  ComponentPtr c;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  ModelPtr m;
  undefined1 local_68 [8];
  string e;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Component_validName_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"valid_name",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"valid_name\"/>\n</model>\n"
             ,(allocator<char> *)
              ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"",
             (allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  createModelWithComponent((string *)local_80,local_a0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_80);
  libcellml::ComponentEntity::component
            ((ulong)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&printer.
                            super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::NamedEntity::setName((string *)peVar2);
  libcellml::Printer::create();
  peVar3 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_120,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_128);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x32,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((EqHelper<false> *)local_140,"\"valid_name\"","c->name()",(char (*) [11])"valid_name",
             &local_160);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_80);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Component, validName)
{
    const std::string in = "valid_name";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"valid_name\"/>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    c->setName(in);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
    EXPECT_EQ("valid_name", c->name());
}